

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

long CalculateTruncatedMedian<long>(vector<long,_std::allocator<long>_> *scores)

{
  long lVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  reference pvVar3;
  long in_FS_OFFSET;
  size_t size;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffb8;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffc0;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffc8;
  vector<long,_std::allocator<long>_> *this;
  long local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::vector<long,_std::allocator<long>_>::size(in_stack_ffffffffffffffb8);
  if (sVar2 == 0) {
    local_10 = 0;
  }
  else {
    __first = std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffffc0);
    __last = std::vector<long,_std::allocator<long>_>::end(in_stack_ffffffffffffffc0);
    std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
              ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               __first._M_current,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               __last._M_current);
    if ((sVar2 & 1) == 0) {
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                         (in_stack_ffffffffffffffc8,(size_type)in_stack_ffffffffffffffc0);
      this = (vector<long,_std::allocator<long>_> *)*pvVar3;
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                         (this,(size_type)in_stack_ffffffffffffffc0);
      local_10 = ((long)&(this->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start + *pvVar3) / 2;
    }
    else {
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                         (in_stack_ffffffffffffffc8,(size_type)in_stack_ffffffffffffffc0);
      local_10 = *pvVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static T CalculateTruncatedMedian(std::vector<T>& scores)
{
    size_t size = scores.size();
    if (size == 0) {
        return 0;
    }

    std::sort(scores.begin(), scores.end());
    if (size % 2 == 0) {
        return (scores[size / 2 - 1] + scores[size / 2]) / 2;
    } else {
        return scores[size / 2];
    }
}